

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O0

void __thiscall Jinx::Impl::FunctionSignature::Write(FunctionSignature *this,BinaryWriter *writer)

{
  bool bVar1;
  size_type sVar2;
  reference_conflict1 pFVar3;
  reference val;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *name;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  *__range3;
  FunctionSignaturePart *part;
  const_iterator __end2;
  const_iterator __begin2;
  FunctionSignaturePartsI *__range2;
  BinaryWriter *writer_local;
  FunctionSignature *this_local;
  
  BinaryWriter::Write(writer,this->m_id);
  BinaryWriter::Write<Jinx::Impl::VisibilityType,unsigned_char>(writer,this->m_visibility);
  BinaryWriter::Write(writer,&this->m_libraryName);
  sVar2 = std::
          vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ::size(&this->m_parts);
  BinaryWriter::Write(writer,(uint8_t)sVar2);
  __end2 = std::
           vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ::begin(&this->m_parts);
  part = (FunctionSignaturePart *)
         std::
         vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
         ::end(&this->m_parts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                                *)&part);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
             ::operator*(&__end2);
    BinaryWriter::Write<Jinx::Impl::FunctionSignaturePartType,unsigned_char>
              (writer,pFVar3->partType);
    BinaryWriter::Write(writer,(bool)(pFVar3->optional & 1));
    BinaryWriter::Write<Jinx::ValueType,unsigned_char>(writer,pFVar3->valueType);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
            ::size(&pFVar3->names);
    BinaryWriter::Write(writer,(uint8_t)sVar2);
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ::begin(&pFVar3->names);
    name = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
           ::end(&pFVar3->names);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
                                  *)&name);
      if (!bVar1) break;
      val = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
            ::operator*(&__end3);
      BinaryWriter::Write(writer,val);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

inline_t void FunctionSignature::Write(BinaryWriter & writer) const
	{
		// Write this object to a memory buffer
		writer.Write(m_id);
		writer.Write<VisibilityType, uint8_t>(m_visibility);
		writer.Write(m_libraryName);
		writer.Write(static_cast<uint8_t>(m_parts.size()));
		for (const auto & part : m_parts)
		{
			writer.Write<FunctionSignaturePartType, uint8_t>(part.partType);
			writer.Write(part.optional);
			writer.Write<ValueType, uint8_t>(part.valueType);
			writer.Write(static_cast<uint8_t>(part.names.size()));
			for (const auto & name : part.names)
			{
				writer.Write(name);
			}
		}
	}